

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<true,false,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  
  iVar2 = *(int *)(this + 0x14);
  if ((long)iVar2 < 1) {
    dVar7 = 0.0;
  }
  else {
    lVar3 = *(long *)(this + 0xf8);
    lVar4 = *(long *)(this + 0x78);
    lVar5 = *(long *)(this + 0xf0);
    auVar9 = ZEXT816(0);
    lVar6 = 0;
    do {
      fVar10 = *(float *)(lVar3 + lVar6 * 4) / *(float *)(lVar5 + lVar6 * 4);
      outDerivatives[lVar6] = (double)fVar10;
      auVar11._0_8_ = (double)(fVar10 * fVar10);
      auVar11._8_8_ = 0;
      auVar8._0_8_ = (double)auVar9._0_4_;
      auVar8._8_8_ = auVar9._8_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *(ulong *)(lVar4 + lVar6 * 8);
      auVar1 = vfmadd231sd_fma(auVar8,auVar11,auVar1);
      lVar6 = lVar6 + 1;
      auVar9._0_4_ = (float)auVar1._0_8_;
      auVar9._4_12_ = auVar1._4_12_;
    } while (iVar2 != lVar6);
    dVar7 = (double)auVar9._0_4_;
  }
  *outSumSquaredDerivatives = dVar7;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}